

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O3

bool __thiscall Clasp::MovingAvg::push(MovingAvg *this,uint32 val)

{
  uint64 uVar1;
  double dVar2;
  uint64 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar4 = *(uint *)&this->field_0x14;
  uVar5 = uVar4 & 0x1fffffff;
  if (uVar5 == 0) {
    uVar3 = (this->extra_).num;
    uVar1 = uVar3 + 1;
    (this->extra_).num = uVar1;
    auVar11._8_4_ = (int)(uVar3 >> 0x20);
    auVar11._0_8_ = uVar3;
    auVar11._12_4_ = 0x45300000;
    auVar10._8_4_ = (int)(uVar1 >> 0x20);
    auVar10._0_8_ = uVar1;
    auVar10._12_4_ = 0x45300000;
    this->avg_ = (((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * this->avg_ +
                 (double)val) /
                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    uVar5 = 0;
    goto LAB_0016efb3;
  }
  if ((uVar4 >> 0x1e & 1) == 0) {
    dVar8 = this->avg_;
    uVar7 = (ulong)this->pos_;
    uVar6 = (this->extra_).sma[uVar7];
    (this->extra_).sma[uVar7] = val;
    if ((uVar4 >> 0x1d & 1) == 0) {
      dVar8 = (dVar8 * (double)uVar7 + (double)val) / (double)(uVar7 + 1);
    }
    else {
      dVar8 = dVar8 + ((double)val - (double)uVar6) / (double)uVar5;
    }
    this->avg_ = dVar8;
    uVar4 = *(uint *)&this->field_0x14;
    uVar5 = uVar4 & 0x1fffffff;
    goto LAB_0016efb3;
  }
  if ((uVar4 >> 0x1d & 1) == 0) {
    dVar8 = this->avg_;
    if ((int)uVar4 < 0) {
      dVar2 = (this->extra_).alpha;
      dVar9 = dVar2;
      if ((this->pos_ < 0x20) &&
         (dVar9 = (double)(0x3ff0000000000000 - ((ulong)this->pos_ << 0x34)), dVar9 <= dVar2)) {
        dVar9 = dVar2;
      }
      dVar9 = ((double)val - dVar8) * dVar9;
      goto LAB_0016efab;
    }
    dVar9 = (dVar8 * (double)this->pos_ + (double)val) / (double)((ulong)this->pos_ + 1);
  }
  else {
    dVar8 = this->avg_;
    dVar9 = ((double)val - dVar8) * (this->extra_).alpha;
LAB_0016efab:
    dVar9 = dVar9 + dVar8;
  }
  this->avg_ = dVar9;
LAB_0016efb3:
  uVar6 = this->pos_ + 1;
  this->pos_ = uVar6;
  if (uVar6 == uVar5) {
    this->pos_ = 0;
    uVar4 = uVar4 | 0x20000000;
    *(uint *)&this->field_0x14 = uVar4;
  }
  return (bool)((byte)(uVar4 >> 0x1d) & 1);
}

Assistant:

bool push(uint32 val) {
		if      (!win_)   { avg_ = cma(avg_, val, extra_.num++); }
		else if (!ema_)   { avg_ = sma(avg_, val, extra_.sma, win_, pos_, valid()); }
		else if (valid()) { avg_ = ema(avg_, val, extra_.alpha); }
		else              { avg_ = smooth_ ? ema(avg_, val, smoothAlpha(extra_.alpha, pos_)) : cma(avg_, val, pos_); }
		if (++pos_ == win_) { pos_ = 0; full_ = 1; }
		return valid();
	}